

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void __thiscall proto3_unittest::TestOneof2::~TestOneof2(TestOneof2 *this)

{
  TestOneof2 *this_local;
  
  ~TestOneof2(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestOneof2::~TestOneof2() {
  // @@protoc_insertion_point(destructor:proto3_unittest.TestOneof2)
  SharedDtor(*this);
}